

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occurrencetocsv.cpp
# Opt level: O1

void d(longlong g,int *y,int *mm,int *dd)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  lVar2 = SUB168(SEXT816(g * 10000 + 0x39bc) * SEXT816(-0x6d027e1cb5d60cfd),8) + g * 10000 + 0x39bc;
  iVar1 = (int)(lVar2 >> 0x15) - (int)(lVar2 >> 0x3f);
  *y = iVar1;
  iVar3 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
  iVar4 = (int)((ulong)((long)iVar1 * -0x51eb851f) >> 0x20);
  iVar3 = ((int)g - (iVar3 >> 2)) + iVar1 * -0x16d + iVar1 / 100 + ((iVar4 >> 7) - (iVar4 >> 0x1f));
  if (iVar3 < 0) {
    iVar4 = iVar1 + -1;
    *y = iVar4;
    iVar3 = iVar1 + 2;
    if (-1 < iVar4) {
      iVar3 = iVar4;
    }
    iVar1 = (int)((ulong)((long)iVar4 * -0x51eb851f) >> 0x20);
    iVar3 = ((int)g - (iVar3 >> 2)) + iVar4 * -0x16d + iVar4 / 100 +
            ((iVar1 >> 7) - (iVar1 >> 0x1f));
  }
  iVar1 = iVar3 * 100 + 0x34;
  iVar4 = iVar1 >> 0x1f;
  iVar1 = iVar1 / 0xbf4 + iVar4;
  iVar5 = (iVar1 - iVar4) + 2;
  *mm = iVar5 % 0xc + 1;
  *y = *y + iVar5 / 0xc;
  iVar1 = (int)((ulong)((long)((iVar1 - iVar4) * 0x132 + 5) * -0x66666667) >> 0x20);
  *dd = ((iVar1 >> 2) - (iVar1 >> 0x1f)) + iVar3 + 1;
  return;
}

Assistant:

void d(long long g, int &y, int &mm, int &dd)
{
	y = (10000 * g + 14780) / 3652425;
	int ddd = g - (365 * y + y / 4 - y / 100 + y / 400);
	if (ddd < 0) {
		y = y - 1;
		ddd = g - (365 * y + y / 4 - y / 100 + y / 400);
	}
	int mi = (100 * ddd + 52) / 3060;
	mm = (mi + 2) % 12 + 1;
	y = y + (mi + 2) / 12;
	dd = ddd - (mi * 306 + 5) / 10 + 1;
	return;
}